

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O3

int scroll_indicator_pos_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  long lVar5;
  long val_1;
  long val_2;
  float fVar6;
  Am_Object scroll_bar;
  Am_Value value_2;
  Am_Value value_1;
  Am_Value value_v;
  Am_Object local_60;
  Am_Value local_58;
  Am_Value local_48;
  Am_Value local_38;
  float local_28;
  float local_24;
  
  iVar2 = 10;
  Am_Object::Get_Object(&local_60,(Am_Slot_Key)self,10);
  bVar1 = Am_Object::Valid(&local_60);
  if (bVar1) {
    pAVar4 = Am_Object::Get(&local_60,0x1b2,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = Am_Object::Get(&local_60,0x1b3,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    local_38.type = 0;
    local_38.value.wrapper_value = (Am_Wrapper *)0x0;
    local_48.type = 0;
    local_48.value.wrapper_value = (Am_Wrapper *)0x0;
    local_58.type = 0;
    local_58.value.wrapper_value = (Am_Wrapper *)0x0;
    pAVar4 = Am_Object::Get(&local_60,0x169,0);
    Am_Value::operator=(&local_38,pAVar4);
    pAVar4 = Am_Object::Get(&local_60,0x181,0);
    Am_Value::operator=(&local_48,pAVar4);
    pAVar4 = Am_Object::Get(&local_60,0x182,0);
    Am_Value::operator=(&local_58,pAVar4);
    if (((local_38.type == 2) && (local_48.type == 2)) && (local_58.type == 2)) {
      lVar5 = Am_Value::operator_cast_to_long(&local_38);
      val_1 = Am_Value::operator_cast_to_long(&local_48);
      val_2 = Am_Value::operator_cast_to_long(&local_58);
      lVar5 = Am_Clip_And_Map(lVar5,val_1,val_2,(long)iVar2,(long)iVar3);
      iVar2 = (int)lVar5;
    }
    else {
      local_24 = Am_Value::operator_cast_to_float(&local_38);
      local_28 = Am_Value::operator_cast_to_float(&local_48);
      fVar6 = Am_Value::operator_cast_to_float(&local_58);
      fVar6 = Am_Clip_And_Map(local_24,local_28,fVar6,(float)iVar2,(float)iVar3);
      iVar2 = (int)fVar6;
    }
    Am_Value::~Am_Value(&local_58);
    Am_Value::~Am_Value(&local_48);
    Am_Value::~Am_Value(&local_38);
  }
  Am_Object::~Am_Object(&local_60);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, scroll_indicator_pos)
{
  int return_val;
  Am_Object scroll_bar = self.Get_Owner();
  if (!scroll_bar.Valid())
    return 10;
  int minpos = scroll_bar.Get(Am_SCROLL_AREA_MIN);
  int maxpos = scroll_bar.Get(Am_SCROLL_AREA_MAX);
  Am_Value value_v;
  Am_Value value_1;
  Am_Value value_2;
  value_v = scroll_bar.Get(Am_VALUE);
  value_1 = scroll_bar.Get(Am_VALUE_1);
  value_2 = scroll_bar.Get(Am_VALUE_2);

  if (value_v.type == Am_INT && value_1.type == Am_INT &&
      value_2.type == Am_INT)
    return_val =
        (int)Am_Clip_And_Map((long)value_v, (long)value_1, (long)value_2,
                             (long)minpos, (long)maxpos);
  else // calc in float and then convert result to integers
    return_val =
        (int)Am_Clip_And_Map((float)value_v, (float)value_1, (float)value_2,
                             (float)minpos, (float)maxpos);
  return return_val;
}